

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

void kmp_set_defaults_(char *str,int len)

{
  undefined4 in_ESI;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  __kmp_aux_set_defaults
            ((char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  return;
}

Assistant:

void FTN_STDCALL FTN_SET_DEFAULTS(char const *str
#ifndef PASS_ARGS_BY_VALUE
                                  ,
                                  int len
#endif
                                  ) {
#ifndef KMP_STUB
#ifdef PASS_ARGS_BY_VALUE
  int len = (int)KMP_STRLEN(str);
#endif
  __kmp_aux_set_defaults(str, len);
#endif
}